

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_kernel_int8_sse
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char *pcVar1;
  short *psVar2;
  char *pcVar3;
  char *pcVar4;
  int in_ECX;
  long lVar5;
  int in_EDX;
  Mat *in_RDI;
  int i_1;
  short *tmpp;
  int j;
  int i;
  short tmp [4] [3];
  char *k2;
  char *k1;
  char *k0;
  short *kernel_tm0;
  char *kernel0;
  int q;
  int p;
  short ktm [4] [3];
  Allocator *in_stack_ffffffffffffff00;
  Mat *this;
  size_t in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  int iVar6;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int iVar7;
  int in_stack_ffffffffffffff24;
  Mat *in_stack_ffffffffffffff28;
  Mat local_98;
  short *local_50;
  char *local_48;
  int local_40;
  int local_3c;
  short local_38 [16];
  int local_18;
  int local_14;
  Mat *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
              (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
              in_stack_ffffffffffffff14,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_38[0] = 2;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 1;
  local_38[4] = 1;
  local_38[5] = 1;
  local_38[6] = 1;
  local_38[7] = -1;
  local_38[8] = 1;
  local_38[9] = 0;
  local_38[10] = 0;
  local_38[0xb] = 2;
  for (local_3c = 0; local_3c < local_18; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < local_14; local_40 = local_40 + 1) {
      local_48 = Mat::operator_cast_to_signed_char_(local_8);
      local_48 = local_48 + (long)(local_40 * 9) + (long)(local_3c * local_14 * 9);
      this = &local_98;
      Mat::channel(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      psVar2 = Mat::row<short>(this,local_40);
      Mat::~Mat((Mat *)0x1cbf06);
      pcVar1 = local_48;
      pcVar3 = local_48 + 3;
      pcVar4 = local_48 + 6;
      local_50 = psVar2;
      for (in_stack_ffffffffffffff24 = 0; in_stack_ffffffffffffff24 < 4;
          in_stack_ffffffffffffff24 = in_stack_ffffffffffffff24 + 1) {
        *(short *)(&stack0xffffffffffffff28 + (long)in_stack_ffffffffffffff24 * 6) =
             (short)*pcVar1 * local_38[(long)in_stack_ffffffffffffff24 * 3] +
             (short)pcVar1[1] * local_38[(long)in_stack_ffffffffffffff24 * 3 + 1] +
             (short)pcVar1[2] * local_38[(long)in_stack_ffffffffffffff24 * 3 + 2];
        *(short *)(&stack0xffffffffffffff2a + (long)in_stack_ffffffffffffff24 * 6) =
             (short)*pcVar3 * local_38[(long)in_stack_ffffffffffffff24 * 3] +
             (short)pcVar1[4] * local_38[(long)in_stack_ffffffffffffff24 * 3 + 1] +
             (short)pcVar1[5] * local_38[(long)in_stack_ffffffffffffff24 * 3 + 2];
        *(short *)(&stack0xffffffffffffff2c + (long)in_stack_ffffffffffffff24 * 6) =
             (short)*pcVar4 * local_38[(long)in_stack_ffffffffffffff24 * 3] +
             (short)pcVar1[7] * local_38[(long)in_stack_ffffffffffffff24 * 3 + 1] +
             (short)pcVar1[8] * local_38[(long)in_stack_ffffffffffffff24 * 3 + 2];
      }
      for (iVar7 = 0; iVar7 < 4; iVar7 = iVar7 + 1) {
        lVar5 = (long)iVar7 * 6;
        for (iVar6 = 0; iVar6 < 4; iVar6 = iVar6 + 1) {
          local_50[iVar7 * 4 + iVar6] =
               *(short *)(&stack0xffffffffffffff28 + lVar5) * local_38[(long)iVar6 * 3] +
               *(short *)(&stack0xffffffffffffff2a + lVar5) * local_38[(long)iVar6 * 3 + 1] +
               *(short *)(&stack0xffffffffffffff2c + lVar5) * local_38[(long)iVar6 * 3 + 2];
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_int8_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    kernel_tm.create(4 * 4, inch, outch, (size_t)2u);

    // G
    const short ktm[4][3] = {
        {2, 0, 0},
        {1, 1, 1},
        {1, -1, 1},
        {0, 0, 2}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = (short)k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = (short)k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = (short)k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}